

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

void __thiscall Imf_2_5::Image::eraseChannel(Image *this,string *name)

{
  long lVar1;
  long *plVar2;
  iterator __position;
  int y;
  long lVar3;
  int x;
  long lVar4;
  long lVar5;
  
  lVar5 = 0;
  for (lVar3 = 0; lVar3 < (this->_levels)._sizeX; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar1 = (this->_levels)._sizeY, lVar4 < lVar1; lVar4 = lVar4 + 1) {
      plVar2 = *(long **)((long)(this->_levels)._data + lVar4 * 8 + lVar1 * lVar5);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x28))(plVar2,name);
      }
    }
    lVar5 = lVar5 + 8;
  }
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::Image::ChannelInfo>_>_>
               ::find(&(this->_channels)._M_t,name);
  if ((_Rb_tree_header *)__position._M_node != &(this->_channels)._M_t._M_impl.super__Rb_tree_header
     ) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Imf_2_5::Image::ChannelInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Imf_2_5::Image::ChannelInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Imf_2_5::Image::ChannelInfo>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Imf_2_5::Image::ChannelInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Imf_2_5::Image::ChannelInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Imf_2_5::Image::ChannelInfo>>>
                        *)&this->_channels,__position);
    return;
  }
  return;
}

Assistant:

void                   
Image::eraseChannel (const std::string &name)
{
    //
    // Note: eraseChannel() is called to clean up if an exception is
    // thrown during a call during insertChannel(), so eraseChannel()
    // must work correctly even after an incomplete insertChannel()
    // operation.
    //

    for (int y = 0; y < _levels.height(); ++y)
        for (int x = 0; x < _levels.width(); ++x)
            if (_levels[y][x])
                _levels[y][x]->eraseChannel (name);

    ChannelMap::iterator i = _channels.find (name);

    if (i != _channels.end())
        _channels.erase (i);
}